

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O1

void __thiscall anon_unknown.dwarf_6027d3::VectorType::printLeft(VectorType *this,OutputStream *S)

{
  Node *pNVar1;
  long *plVar2;
  void *pvVar3;
  size_t N;
  StringView SVar4;
  
  if (this->IsPixel == true) {
    OutputStream::grow(S,0xd);
    builtin_strncpy(S->Buffer + S->CurrentPosition,"pixel vector[",0xd);
    S->CurrentPosition = S->CurrentPosition + 0xd;
  }
  else {
    pNVar1 = this->BaseType;
    (*pNVar1->_vptr_Node[4])(pNVar1,S);
    if (pNVar1->RHSComponentCache != No) {
      (*pNVar1->_vptr_Node[5])(pNVar1,S);
    }
    OutputStream::grow(S,8);
    builtin_strncpy(S->Buffer + S->CurrentPosition," vector[",8);
    S->CurrentPosition = S->CurrentPosition + 8;
    plVar2 = (long *)(this->Dimension).First;
    pvVar3 = (this->Dimension).Second;
    if (pvVar3 == (void *)0x0 && plVar2 != (long *)0x0) {
      (**(code **)(*plVar2 + 0x20))(plVar2,S);
      if (*(char *)((long)plVar2 + 9) != '\x01') {
        (**(code **)(*plVar2 + 0x28))(plVar2,S);
      }
      goto LAB_001f432a;
    }
    if (pvVar3 == (void *)0x0 || plVar2 == (long *)0x0) goto LAB_001f432a;
  }
  SVar4 = NodeOrString::asString(&this->Dimension);
  N = (long)SVar4.Last - (long)SVar4.First;
  if (N != 0) {
    OutputStream::grow(S,N);
    memmove(S->Buffer + S->CurrentPosition,SVar4.First,N);
    S->CurrentPosition = S->CurrentPosition + N;
  }
LAB_001f432a:
  OutputStream::grow(S,1);
  S->Buffer[S->CurrentPosition] = ']';
  S->CurrentPosition = S->CurrentPosition + 1;
  return;
}

Assistant:

void printLeft(OutputStream &S) const override {
    if (IsPixel) {
      S += "pixel vector[";
      S += Dimension.asString();
      S += "]";
    } else {
      BaseType->print(S);
      S += " vector[";
      if (Dimension.isNode())
        Dimension.asNode()->print(S);
      else if (Dimension.isString())
        S += Dimension.asString();
      S += "]";
    }
  }